

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O3

StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
* __thiscall
google::protobuf::json_internal::JsonLexer::ParseUtf8
          (StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
           *__return_storage_ptr__,JsonLexer *this)

{
  JsonLocation *pJVar1;
  size_t *psVar2;
  int iVar3;
  size_t sVar4;
  ushort uVar5;
  undefined8 uVar6;
  anon_union_8_2_a3c22f61_for_StatusOrData<google::protobuf::json_internal::BufferingGuard>_3 aVar7;
  char cVar8;
  uint uVar9;
  anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1 aVar10;
  anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1 aVar11;
  char *pcVar12;
  Status *this_00;
  string_view sVar13;
  Status _status;
  Status _status_6;
  LocationWith<google::protobuf::json_internal::Mark> mark;
  JsonLocation loc;
  undefined1 local_158 [8];
  undefined1 local_150 [16];
  undefined1 local_140 [40];
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 local_110;
  undefined4 uStack_10c;
  bool bStack_108;
  undefined3 uStack_107;
  int iStack_104;
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  byte local_e0;
  anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1 local_d8;
  anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1 local_d0;
  anon_union_8_2_a3c22f61_for_StatusOrData<google::protobuf::json_internal::BufferingGuard>_3
  local_c8;
  undefined1 local_c0;
  uint7 uStack_bf;
  size_t sStack_b8;
  uint local_ac;
  anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1 local_a8;
  pointer local_a0;
  pointer local_98;
  size_t sStack_90;
  anon_union_8_2_a3c22f61_for_StatusOrData<google::protobuf::json_internal::BufferingGuard>_3
  local_88;
  anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1 local_80;
  size_t local_78;
  size_t sStack_70;
  size_t local_68;
  MessagePath *pMStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  bool bStack_40;
  undefined3 uStack_3f;
  int iStack_3c;
  
  SkipToToken((JsonLexer *)local_150);
  if ((anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)local_150._0_8_ ==
      (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)0x1) {
    cVar8 = ZeroCopyBufferedStream::PeekChar(&this->stream_);
    pJVar1 = &this->json_loc_;
    if ((cVar8 == '\'') && ((this->options_).allow_legacy_syntax == false)) {
      JsonLocation::Invalid((JsonLocation *)local_150,pJVar1,0xc,"expected \'\"\'");
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::StatusOrData<absl::lts_20240722::Status,_0>
                (&__return_storage_ptr__->
                  super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                 ,(Status *)local_150);
      if ((local_150._0_8_ & 1) == 0) {
        absl::lts_20240722::status_internal::StatusRep::Unref();
      }
    }
    else {
      local_58 = *(undefined4 *)&pJVar1->offset;
      uStack_54 = *(undefined4 *)((long)&(this->json_loc_).offset + 4);
      uStack_50 = (undefined4)(this->json_loc_).line;
      uStack_4c = *(undefined4 *)((long)&(this->json_loc_).line + 4);
      local_48 = (undefined4)(this->json_loc_).col;
      uStack_44 = *(undefined4 *)((long)&(this->json_loc_).col + 4);
      _bStack_40 = *(undefined4 *)&(this->json_loc_).path;
      iStack_3c = *(int *)((long)&(this->json_loc_).path + 4);
      pcVar12 = "\'";
      if (cVar8 != '\'') {
        pcVar12 = "\"";
      }
      Expect((JsonLexer *)local_150,this,1,pcVar12);
      if ((anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)local_150._0_8_ ==
          (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)0x1) {
        local_d0 = (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)&local_c0;
        local_c8 = (anon_union_8_2_a3c22f61_for_StatusOrData<google::protobuf::json_internal::BufferingGuard>_3
                    )0x0;
        local_c0 = 0;
        ZeroCopyBufferedStream::BeginMark((ZeroCopyBufferedStream *)&local_88.data_);
        local_78 = pJVar1->offset;
        sStack_70 = (this->json_loc_).line;
        local_68 = (this->json_loc_).col;
        pMStack_60 = (this->json_loc_).path;
        local_ac = (uint)(cVar8 == '\'') * 5 + 0x22;
LAB_002b7616:
        while (ZeroCopyBufferedStream::BufferAtLeast
                         ((ZeroCopyBufferedStream *)local_150,(size_t)this), uVar6 = local_150._0_8_
              , (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)local_150._0_8_ ==
                (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)0x1) {
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::BufferingGuard>::~StatusOrData
                    ((StatusOrData<google::protobuf::json_internal::BufferingGuard> *)local_150);
          aVar10._0_1_ = ZeroCopyBufferedStream::PeekChar(&this->stream_);
          ZeroCopyBufferedStream::Advance((ZeroCopyBufferedStream *)local_150,(size_t)this);
          aVar7 = local_c8;
          if ((anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)local_150._0_8_ !=
              (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)0x1) {
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::StatusOrData<const_absl::lts_20240722::Status,_0>
                      (&__return_storage_ptr__->
                        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       ,(Status *)local_150);
LAB_002b7a68:
            this_00 = (Status *)local_150;
            goto LAB_002b7a6d;
          }
          (this->json_loc_).offset = (this->json_loc_).offset + 1;
          psVar2 = &(this->json_loc_).col;
          *psVar2 = *psVar2 + 1;
          aVar10.status_.rep_._1_7_ = 0;
          uVar9 = (uint)aVar10._0_1_;
          cVar8 = (char)&local_d0;
          if ((aVar10._0_1_ == 0x22) || (uVar9 == 0x27)) {
            if (local_ac == uVar9) {
              if (local_c8 ==
                  (anon_union_8_2_a3c22f61_for_StatusOrData<google::protobuf::json_internal::BufferingGuard>_3
                   )0x0) {
                sVar4 = *(size_t *)((long)local_80 + 0x38);
                local_f0._0_8_ = ~(ulong)local_88 + sVar4;
                iVar3 = *(int *)((long)local_80 + 0x4c);
                if (iVar3 == 0) {
                  *(size_t *)((long)local_80 + 0x40) = sVar4;
                }
                local_100._0_8_ = local_80;
                local_100._8_8_ = local_88;
                local_e0 = 1;
                local_d8 = local_80;
                *(int *)((long)local_80 + 0x4c) = iVar3 + 2;
                if (iVar3 == -1) {
                  *(size_t *)((long)local_80 + 0x40) = sVar4;
                }
                ZeroCopyBufferedStream::DownRefBuffer((ZeroCopyBufferedStream *)local_80);
              }
              else {
                local_a8 = (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)&local_98;
                if (local_d0 == (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)&local_c0
                   ) {
                  sStack_90 = sStack_b8;
                  aVar10 = local_d0;
LAB_002b7c8c:
                  local_d0 = aVar10;
                  local_100._0_8_ = local_f0;
                  local_98 = (pointer)CONCAT71(uStack_bf,local_c0);
                  local_f0._0_8_ = local_98;
                  local_f0._8_8_ = sStack_90;
                }
                else {
                  local_f0._0_8_ = CONCAT71(uStack_bf,local_c0);
                  aVar10 = (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)&local_c0;
                  if (local_d0 == local_a8) goto LAB_002b7c8c;
                  local_100._0_8_ = local_d0;
                  local_d0 = (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)&local_c0;
                }
                local_c0 = 0;
                local_c8 = (anon_union_8_2_a3c22f61_for_StatusOrData<google::protobuf::json_internal::BufferingGuard>_3
                            )0x0;
                local_100._8_8_ = aVar7;
                local_a0 = (pointer)0x0;
                local_98 = (pointer)((ulong)uStack_bf << 8);
                local_e0 = 0;
                local_d8 = (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)0x0;
              }
              sVar13 = MaybeOwnedString::AsView((MaybeOwnedString *)local_100);
              cVar8 = utf8_range::IsStructurallyValid(sVar13._M_len,sVar13._M_str);
              if (cVar8 == '\0') {
                JsonLocation::Invalid((JsonLocation *)local_150,pJVar1,0x14,"Invalid UTF-8 string");
                absl::lts_20240722::internal_statusor::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::StatusOrData<absl::lts_20240722::Status,_0>
                          (&__return_storage_ptr__->
                            super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           ,(Status *)local_150);
                if ((local_150._0_8_ & 1) == 0) {
                  absl::lts_20240722::status_internal::StatusRep::Unref();
                }
              }
              else {
                local_140[0x10] = local_e0;
                local_158 = (undefined1  [8])local_150;
                (*std::__detail::__variant::
                  __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>_&&>
                  ::_S_vtable._M_arr[local_e0]._M_data)
                          ((anon_class_8_1_a78179b7_conflict2 *)local_158,
                           (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                            *)local_100);
                local_140._24_8_ = local_d8;
                if ((local_d8 != (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)0x0) &&
                   (iVar3 = *(int *)((long)local_d8 + 0x4c),
                   *(int *)((long)local_d8 + 0x4c) = iVar3 + 1, iVar3 == 0)) {
                  *(size_t *)((long)local_d8 + 0x40) = *(size_t *)((long)local_d8 + 0x38);
                }
                local_110 = local_48;
                uStack_10c = uStack_44;
                bStack_108 = bStack_40;
                uStack_107 = uStack_3f;
                iStack_104 = iStack_3c;
                local_140._32_4_ = local_58;
                local_140._36_4_ = uStack_54;
                uStack_118 = uStack_50;
                uStack_114 = uStack_4c;
                absl::lts_20240722::internal_statusor::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>>
                ::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>>
                          ((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>>
                            *)__return_storage_ptr__);
                if ((anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)local_140._24_8_ !=
                    (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)0x0) {
                  ZeroCopyBufferedStream::DownRefBuffer((ZeroCopyBufferedStream *)local_140._24_8_);
                  local_140._24_8_ = (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)0x0;
                }
                (*std::__detail::__variant::
                  __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>_&>
                  ::_S_vtable._M_arr[(byte)local_140[0x10]]._M_data)
                          ((anon_class_1_0_00000001 *)local_158,
                           (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                            *)local_150);
              }
              if (local_d8 != (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)0x0) {
                ZeroCopyBufferedStream::DownRefBuffer((ZeroCopyBufferedStream *)local_d8);
                local_d8 = (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)0x0;
              }
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>_&>
                ::_S_vtable._M_arr[local_e0]._M_data)
                        ((anon_class_1_0_00000001 *)local_150,
                         (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                          *)local_100);
              goto LAB_002b7a72;
            }
LAB_002b7823:
            uVar5 = 0xf;
            if ((byte)~aVar10._0_1_ != 0) {
              for (; (byte)~aVar10._0_1_ >> uVar5 == 0; uVar5 = uVar5 - 1) {
              }
            }
            uVar9 = (uVar5 ^ 0xf) - 8;
            if (aVar10._0_1_ == 0xff) {
              uVar9 = 8;
            }
            if ((4 < uVar9) || ((0x1dU >> (uVar9 & 0x1f) & 1) == 0)) {
              JsonLocation::Invalid((JsonLocation *)local_150,pJVar1,0x17,"invalid UTF-8 in string")
              ;
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::StatusOrData<absl::lts_20240722::Status,_0>
                        (&__return_storage_ptr__->
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         ,(Status *)local_150);
              if ((local_150._0_8_ & 1) == 0) {
                absl::lts_20240722::status_internal::StatusRep::Unref();
              }
              goto LAB_002b7a72;
            }
            sVar4 = *(size_t *)(&DAT_003d5f40 + (ulong)uVar9 * 8);
            if (local_c8 !=
                (anon_union_8_2_a3c22f61_for_StatusOrData<google::protobuf::json_internal::BufferingGuard>_3
                 )0x0) {
              std::__cxx11::string::push_back(cVar8);
            }
            ZeroCopyBufferedStream::Take
                      ((StatusOr<google::protobuf::json_internal::MaybeOwnedString> *)local_150,
                       &this->stream_,sVar4);
            local_100._0_8_ = local_150._0_8_;
            if ((local_150._0_8_ & 1) == 0) {
              LOCK();
              *(int *)local_150._0_8_ = *(int *)local_150._0_8_ + 1;
              UNLOCK();
            }
            if ((anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)local_150._0_8_ !=
                (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)0x1) {
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::StatusOrData<const_absl::lts_20240722::Status,_0>
                        (&__return_storage_ptr__->
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         ,(Status *)local_100);
              absl::lts_20240722::Status::~Status((Status *)local_100);
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::MaybeOwnedString>::~StatusOrData
                        ((StatusOrData<google::protobuf::json_internal::MaybeOwnedString> *)
                         local_150);
              goto LAB_002b7a72;
            }
            if (local_c8 !=
                (anon_union_8_2_a3c22f61_for_StatusOrData<google::protobuf::json_internal::BufferingGuard>_3
                 )0x0) {
              sVar13 = MaybeOwnedString::AsView((MaybeOwnedString *)(local_150 + 8));
              std::__cxx11::string::append((char *)&local_d0,(ulong)sVar13._M_str);
            }
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::MaybeOwnedString>::~StatusOrData
                      ((StatusOrData<google::protobuf::json_internal::MaybeOwnedString> *)local_150)
            ;
          }
          else {
            if (uVar9 != 0x5c) {
              if ((0x20 < (byte)(aVar10._0_1_ + 1)) ||
                 ((this->options_).allow_legacy_syntax != false)) goto LAB_002b7823;
              local_100._8_8_ =
                   absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<unsigned_char>;
              local_100._0_8_ = aVar10;
              absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                        (local_150,"invalid control character 0x%02x in string",0x2a,local_100,1);
              JsonLocation::Invalid
                        ((JsonLocation *)local_158,pJVar1,local_150._8_8_,local_150._0_8_);
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::StatusOrData<absl::lts_20240722::Status,_0>
                        (&__return_storage_ptr__->
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         ,(Status *)local_158);
              if (((ulong)local_158 & 1) == 0) {
                absl::lts_20240722::status_internal::StatusRep::Unref();
              }
LAB_002b7e53:
              if ((undefined1 *)local_150._0_8_ != local_140) {
                operator_delete((void *)local_150._0_8_,(ulong)(local_140._0_8_ + 1));
              }
              goto LAB_002b7a72;
            }
            if (local_c8 ==
                (anon_union_8_2_a3c22f61_for_StatusOrData<google::protobuf::json_internal::BufferingGuard>_3
                 )0x0) {
              sVar4 = *(size_t *)((long)local_80 + 0x38);
              iVar3 = *(int *)((long)local_80 + 0x4c);
              if (iVar3 == 0) {
                *(size_t *)((long)local_80 + 0x40) = sVar4;
              }
              local_150._0_8_ = local_80;
              local_150._8_8_ = local_88;
              local_140._0_8_ = ~(ulong)local_88 + sVar4;
              local_140[0x10] = 1;
              local_140._24_8_ = local_80;
              *(int *)((long)local_80 + 0x4c) = iVar3 + 2;
              if (iVar3 == -1) {
                *(size_t *)((long)local_80 + 0x40) = sVar4;
              }
              ZeroCopyBufferedStream::DownRefBuffer((ZeroCopyBufferedStream *)local_80);
              sVar13 = MaybeOwnedString::AsView((MaybeOwnedString *)local_150);
              local_100._0_8_ = local_f0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_100,sVar13._M_str,sVar13._M_str + sVar13._M_len);
              std::__cxx11::string::operator=((string *)&local_d0.status_,(string *)local_100);
              if ((undefined1 *)local_100._0_8_ != local_f0) {
                operator_delete((void *)local_100._0_8_,(ulong)(local_f0._0_8_ + 1));
              }
              if ((anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)local_140._24_8_ !=
                  (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)0x0) {
                ZeroCopyBufferedStream::DownRefBuffer((ZeroCopyBufferedStream *)local_140._24_8_);
                local_140._24_8_ = (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)0x0;
              }
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>_&>
                ::_S_vtable._M_arr[(byte)local_140[0x10]]._M_data)
                        ((anon_class_1_0_00000001 *)local_158,
                         (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                          *)local_150);
              Mark::Discard((Mark *)&local_88.data_);
            }
            ZeroCopyBufferedStream::BufferAtLeast((ZeroCopyBufferedStream *)local_150,(size_t)this);
            uVar6 = local_150._0_8_;
            if ((anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)local_150._0_8_ !=
                (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)0x1) {
              local_150._0_8_ = (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)0x37;
              local_100._0_8_ = uVar6;
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::BufferingGuard>::~StatusOrData
                        ((StatusOrData<google::protobuf::json_internal::BufferingGuard> *)local_150)
              ;
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::StatusOrData<const_absl::lts_20240722::Status,_0>
                        (&__return_storage_ptr__->
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         ,(Status *)local_100);
              goto LAB_002b7a52;
            }
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::BufferingGuard>::~StatusOrData
                      ((StatusOrData<google::protobuf::json_internal::BufferingGuard> *)local_150);
            aVar11._0_1_ = ZeroCopyBufferedStream::PeekChar(&this->stream_);
            ZeroCopyBufferedStream::Advance((ZeroCopyBufferedStream *)local_150,(size_t)this);
            if ((anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)local_150._0_8_ !=
                (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)0x1) {
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::StatusOrData<const_absl::lts_20240722::Status,_0>
                        (&__return_storage_ptr__->
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         ,(Status *)local_150);
              goto LAB_002b7a68;
            }
            (this->json_loc_).offset = (this->json_loc_).offset + 1;
            psVar2 = &(this->json_loc_).col;
            *psVar2 = *psVar2 + 1;
            aVar11.status_.rep_._1_7_ = 0;
            if (aVar11._0_1_ < 0x62) {
              if (aVar11._0_1_ < 0x2f) {
                if ((aVar11._0_1_ != 0x22) &&
                   ((aVar11._0_1_ != 0x27 || ((this->options_).allow_legacy_syntax == false))))
                goto switchD_002b78f9_caseD_6f;
              }
              else if (aVar11._0_1_ != 0x2f) {
                if (aVar11._0_1_ == 0x55) {
                  if ((this->options_).allow_legacy_syntax == true) goto switchD_002b78f9_caseD_75;
                }
                else if (aVar11._0_1_ == 0x5c) goto LAB_002b79e2;
                goto switchD_002b78f9_caseD_6f;
              }
              goto LAB_002b79e2;
            }
            switch(aVar11._0_1_) {
            case 0x6e:
              break;
            case 0x6f:
            case 0x70:
            case 0x71:
            case 0x73:
switchD_002b78f9_caseD_6f:
              local_100._8_8_ =
                   absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<char>;
              local_100._0_8_ = aVar11;
              absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                        (local_150,"invalid escape char: \'%c\'",0x19,local_100,1);
              JsonLocation::Invalid
                        ((JsonLocation *)local_158,pJVar1,local_150._8_8_,local_150._0_8_);
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::StatusOrData<absl::lts_20240722::Status,_0>
                        (&__return_storage_ptr__->
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         ,(Status *)local_158);
              if (((ulong)local_158 & 1) == 0) {
                absl::lts_20240722::status_internal::StatusRep::Unref();
              }
              goto LAB_002b7e53;
            case 0x72:
              break;
            case 0x74:
              break;
            case 0x75:
switchD_002b78f9_caseD_75:
              std::__cxx11::string::resize((ulong)&local_d0,local_c8._0_1_ + '\x04');
              ParseUnicodeEscape((JsonLexer *)local_150,(char *)this);
              local_100._0_8_ = local_150._0_8_;
              if ((local_150._0_8_ & 1) == 0) {
                LOCK();
                *(int *)local_150._0_8_ = *(int *)local_150._0_8_ + 1;
                UNLOCK();
              }
              if ((anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)local_150._0_8_ ==
                  (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)0x1)
              goto code_r0x002b79ac;
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::StatusOrData<const_absl::lts_20240722::Status,_0>
                        (&__return_storage_ptr__->
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         ,(Status *)local_100);
              absl::lts_20240722::Status::~Status((Status *)local_100);
              absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::~StatusOrData
                        ((StatusOrData<unsigned_long> *)local_150);
              goto LAB_002b7a72;
            default:
              if ((aVar11._0_1_ != 0x62) && (aVar11._0_1_ != 0x66)) goto switchD_002b78f9_caseD_6f;
            }
LAB_002b79e2:
            std::__cxx11::string::push_back(cVar8);
          }
        }
        local_150._0_8_ = (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)0x37;
        local_100._0_8_ = uVar6;
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::BufferingGuard>::~StatusOrData
                  ((StatusOrData<google::protobuf::json_internal::BufferingGuard> *)local_150);
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::StatusOrData<const_absl::lts_20240722::Status,_0>
                  (&__return_storage_ptr__->
                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   ,(Status *)local_100);
LAB_002b7a52:
        this_00 = (Status *)local_100;
LAB_002b7a6d:
        absl::lts_20240722::Status::~Status(this_00);
LAB_002b7a72:
        if (local_80 != (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)0x0) {
          ZeroCopyBufferedStream::DownRefBuffer((ZeroCopyBufferedStream *)local_80);
        }
        if (local_d0 != (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)&local_c0) {
          operator_delete((void *)local_d0,CONCAT71(uStack_bf,local_c0) + 1);
        }
      }
      else {
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::StatusOrData<const_absl::lts_20240722::Status,_0>
                  (&__return_storage_ptr__->
                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   ,(Status *)local_150);
        absl::lts_20240722::Status::~Status((Status *)local_150);
      }
    }
  }
  else {
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::StatusOrData<const_absl::lts_20240722::Status,_0>
              (&__return_storage_ptr__->
                super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
               ,(Status *)local_150);
    if ((local_150._0_8_ & 1) == 0) {
      absl::lts_20240722::status_internal::StatusRep::Unref();
    }
  }
  return __return_storage_ptr__;
code_r0x002b79ac:
  std::__cxx11::string::resize((ulong)&local_d0,local_c8._0_1_ + (char)local_150._8_8_ + -4);
  absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::~StatusOrData
            ((StatusOrData<unsigned_long> *)local_150);
  goto LAB_002b7616;
}

Assistant:

absl::StatusOr<LocationWith<MaybeOwnedString>> JsonLexer::ParseUtf8() {
  RETURN_IF_ERROR(SkipToToken());
  // This is a non-standard extension accepted by the ESF parser that we will
  // need to accept for backwards-compat.
  bool is_single_quote = stream_.PeekChar() == '\'';
  if (!options_.allow_legacy_syntax && is_single_quote) {
    return Invalid("expected '\"'");
  }

  JsonLocation loc = json_loc_;
  RETURN_IF_ERROR(Expect(is_single_quote ? "'" : "\""));

  // on_heap is empty if we do not need to heap-allocate the string.
  std::string on_heap;
  LocationWith<Mark> mark = BeginMark();
  while (true) {
    RETURN_IF_ERROR(stream_.BufferAtLeast(1).status());

    char c = stream_.PeekChar();
    RETURN_IF_ERROR(Advance(1));
    switch (c) {
      case '"':
      case '\'': {
        if (c != (is_single_quote ? '\'' : '"')) {
          goto normal_character;
        }

        // NOTE: the 1 below clips off the " from the end of the string.
        MaybeOwnedString result = on_heap.empty()
                                      ? mark.value.UpToUnread(1)
                                      : MaybeOwnedString{std::move(on_heap)};
        if (utf8_range::IsStructurallyValid(result)) {
          return LocationWith<MaybeOwnedString>{std::move(result), loc};
        }
        return Invalid("Invalid UTF-8 string");
      }
      case '\\': {
        if (on_heap.empty()) {
          // The 1 skips over the `\`.
          on_heap = std::string(mark.value.UpToUnread(1).AsView());
          // Clang-tidy incorrectly notes this as being moved-from multiple
          // times, but it can only occur in one loop iteration. The mark is
          // destroyed only if we need to handle an escape when on_heap is
          // empty. Because this branch unconditionally pushes to on_heap, this
          // condition can never be reached in any iteration that follows it.
          // Thus, at most one move ever actually occurs.
          std::move(mark).value.Discard();
        }
        RETURN_IF_ERROR(stream_.BufferAtLeast(1).status());

        char c = stream_.PeekChar();
        RETURN_IF_ERROR(Advance(1));
        if (c == 'u' || (c == 'U' && options_.allow_legacy_syntax)) {
          // Ensure there is actual space to scribble the UTF-8 onto.
          on_heap.resize(on_heap.size() + 4);
          auto written = ParseUnicodeEscape(&on_heap[on_heap.size() - 4]);
          RETURN_IF_ERROR(written.status());
          on_heap.resize(on_heap.size() - 4 + *written);
        } else {
          char escape = ParseSimpleEscape(c, options_.allow_legacy_syntax);
          if (escape == 0) {
            return Invalid(absl::StrFormat("invalid escape char: '%c'", c));
          }
          on_heap.push_back(escape);
        }
        break;
      }
      normal_character:
      default: {
        uint8_t uc = static_cast<uint8_t>(c);
        // If people have newlines in their strings, that's their problem; it
        // is too difficult to support correctly in our location tracking, and
        // is out of spec, so users will get slightly wrong locations in errors.
        if ((uc < 0x20 || uc == 0xff) && !options_.allow_legacy_syntax) {
          return Invalid(absl::StrFormat(
              "invalid control character 0x%02x in string", uc));
        }

        // Process this UTF-8 code point. We do not need to fully validate it
        // at this stage; we just need to interpret it enough to know how many
        // bytes to read. UTF-8 is a varint encoding satisfying one of the
        // following (big-endian) patterns:
        //
        // 0b0xxxxxxx
        // 0b110xxxxx'10xxxxxx
        // 0b1110xxxx'10xxxxxx'10xxxxxx
        // 0b11110xxx'10xxxxxx'10xxxxxx'10xxxxxx
        size_t lookahead = 0;
        switch (absl::countl_one(uc)) {
          case 0:
            break;
          case 2:
            lookahead = 1;
            break;
          case 3:
            lookahead = 2;
            break;
          case 4:
            lookahead = 3;
            break;
          default:
            return Invalid("invalid UTF-8 in string");
        }

        if (!on_heap.empty()) {
          on_heap.push_back(c);
        }
        auto lookahead_bytes = stream_.Take(lookahead);
        RETURN_IF_ERROR(lookahead_bytes.status());
        if (!on_heap.empty()) {
          absl::string_view view = lookahead_bytes->AsView();
          on_heap.append(view.data(), view.size());
        }
        break;
      }
    }
  }

  return Invalid("EOF inside string");
}